

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeLocalSet(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Index local)

{
  LocalSet *pLVar1;
  bool bVar2;
  Ok local_cd;
  uint local_cc;
  Err local_c8;
  Err *local_a8;
  Err *err;
  Result<wasm::Ok> _val;
  LocalSet curr;
  allocator<char> local_41;
  Err local_40;
  Index local_1c;
  IRBuilder *pIStack_18;
  Index local_local;
  IRBuilder *this_local;
  
  local_1c = local;
  pIStack_18 = this;
  this_local = (IRBuilder *)__return_storage_ptr__;
  if (this->func == (Function *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"local.set is only valid in a function context",&local_41);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_40);
    wasm::Err::~Err(&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    pLVar1 = (LocalSet *)
             ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
    LocalSet::LocalSet(pLVar1);
    UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitLocalSet
              ((Result<wasm::Ok> *)&err,
               (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pLVar1);
    local_a8 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
    bVar2 = local_a8 != (Err *)0x0;
    if (bVar2) {
      wasm::Err::Err(&local_c8,local_a8);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_c8);
      wasm::Err::~Err(&local_c8);
    }
    local_cc = (uint)bVar2;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
    if (local_cc == 0) {
      pLVar1 = Builder::makeLocalSet(&this->builder,local_1c,(Expression *)curr._16_8_);
      push(this,(Expression *)pLVar1);
      Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_cd);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeLocalSet(Index local) {
  if (!func) {
    return Err{"local.set is only valid in a function context"};
  }
  LocalSet curr;
  curr.index = local;
  CHECK_ERR(visitLocalSet(&curr));
  push(builder.makeLocalSet(local, curr.value));
  return Ok{};
}